

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O2

int rtosc_arg_vals_cmp_single(rtosc_arg_val_t *_lhs,rtosc_arg_val_t *_rhs,rtosc_cmp_options *opt)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  char *__s1;
  long lVar7;
  long lVar8;
  uint8_t *__s1_00;
  uint8_t *__s2;
  ulong uVar9;
  char cVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  int32_t iVar14;
  int32_t iVar15;
  size_t __n;
  char *__s2_00;
  rtosc_cmp_options *opt_00;
  bool bVar16;
  byte bVar17;
  bool bVar18;
  bool bVar19;
  uint uVar20;
  ulong uVar21;
  float fVar22;
  double dVar23;
  
  opt_00 = &default_cmp_options;
  if (opt != (rtosc_cmp_options *)0x0) {
    opt_00 = opt;
  }
  bVar17 = _lhs->type;
  if (bVar17 != _rhs->type) {
    return (uint)(_rhs->type < (char)bVar17) * 2 + -1;
  }
  switch(bVar17) {
  case 0x61:
    iVar14 = rtosc_av_arr_len(_lhs);
    iVar15 = rtosc_av_arr_len(_rhs);
    cVar10 = rtosc_av_arr_type(_lhs);
    cVar11 = rtosc_av_arr_type(_rhs);
    if (((cVar10 != cVar11) &&
        ((cVar10 = rtosc_av_arr_type(_lhs), cVar10 != 'T' ||
         (cVar10 = rtosc_av_arr_type(_rhs), cVar10 == '\0')))) &&
       ((cVar10 = rtosc_av_arr_type(_lhs), cVar10 != 'F' ||
        (cVar10 = rtosc_av_arr_type(_rhs), cVar10 == '\0')))) {
      cVar10 = rtosc_av_arr_type(_lhs);
      cVar11 = rtosc_av_arr_type(_rhs);
      return (uint)(cVar11 < cVar10) * 2 + -1;
    }
    iVar12 = rtosc_arg_vals_cmp(_lhs + 1,_rhs + 1,(long)iVar14,(long)iVar15,opt_00);
    return iVar12;
  case 0x62:
    iVar12 = (_lhs->val).i;
    iVar6 = (_rhs->val).i;
    iVar13 = iVar6;
    if (iVar12 < iVar6) {
      iVar13 = iVar12;
    }
    __s1_00 = (_lhs->val).b.data;
    __s2 = (_rhs->val).b.data;
    __n = (size_t)iVar13;
    iVar13 = memcmp(__s1_00,__s2,__n);
    if (iVar12 == iVar6) {
      return iVar13;
    }
    if (iVar13 != 0) {
      return iVar13;
    }
    if (iVar6 < iVar12) {
      return (uint)__s1_00[__n];
    }
    bVar17 = __s2[__n];
LAB_0010e475:
    return -(uint)bVar17;
  case 99:
  case 0x69:
  case 0x72:
    iVar6 = (_lhs->val).i;
    iVar12 = (_rhs->val).i;
    bVar19 = SBORROW4(iVar6,iVar12);
    bVar18 = iVar6 - iVar12 < 0;
    bVar16 = iVar6 == iVar12;
    goto LAB_0010e235;
  case 100:
    dVar3 = opt_00->float_tolerance;
    dVar4 = (_lhs->val).d;
    dVar5 = (_rhs->val).d;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      dVar23 = dVar4 - dVar5;
      uVar21 = -(ulong)(dVar23 < -dVar23);
      if ((double)(~uVar21 & (ulong)dVar23 | (ulong)-dVar23 & uVar21) <= dVar3) {
        return 0;
      }
      bVar16 = dVar4 == dVar5;
      bVar18 = dVar4 < dVar5;
LAB_0010e461:
      bVar16 = !bVar18 && !bVar16;
      goto LAB_0010e464;
    }
    bVar19 = NAN(dVar4) || NAN(dVar5);
    bVar16 = dVar4 == dVar5;
    bVar18 = dVar4 < dVar5;
    break;
  case 0x65:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
    return -1;
  case 0x66:
    dVar3 = opt_00->float_tolerance;
    fVar1 = (_lhs->val).f;
    fVar2 = (_rhs->val).f;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      fVar22 = fVar1 - fVar2;
      uVar20 = -(uint)(fVar22 < -fVar22);
      if ((float)(~uVar20 & (uint)fVar22 | (uint)-fVar22 & uVar20) <= (float)dVar3) {
        return 0;
      }
      bVar16 = fVar1 == fVar2;
      bVar18 = fVar1 < fVar2;
      goto LAB_0010e461;
    }
    bVar19 = NAN(fVar1) || NAN(fVar2);
    bVar16 = fVar1 == fVar2;
    bVar18 = fVar1 < fVar2;
    break;
  case 0x68:
    lVar7 = (_lhs->val).h;
    lVar8 = (_rhs->val).h;
    bVar19 = SBORROW8(lVar7,lVar8);
    bVar18 = lVar7 - lVar8 < 0;
    bVar16 = lVar7 == lVar8;
LAB_0010e235:
    bVar18 = !bVar16 && bVar19 == bVar18;
    if (bVar16) {
      return 0;
    }
    return (bVar18 - 1) + (uint)bVar18;
  case 0x6d:
    iVar12 = memcmp(&_lhs->val,&_rhs->val,4);
    return iVar12;
  case 0x74:
    uVar21 = (_lhs->val).t;
    uVar9 = (_rhs->val).t;
    if (uVar21 == 1) {
      bVar17 = uVar9 != 1;
      goto LAB_0010e475;
    }
    if (uVar9 == 1) {
      return 1;
    }
    if (uVar21 == uVar9) {
      return 0;
    }
    bVar16 = uVar9 < uVar21;
    goto LAB_0010e3e7;
  default:
    uVar21 = (ulong)(bVar17 - 0x2d);
    if (0x27 < bVar17 - 0x2d) {
      return -1;
    }
    if ((0x8212000000U >> (uVar21 & 0x3f) & 1) != 0) {
      return 0;
    }
    if (uVar21 == 0) {
      return -1;
    }
    if (uVar21 != 0x26) {
      return -1;
    }
  case 0x73:
    __s1 = (_lhs->val).s;
    __s2_00 = (_rhs->val).s;
    if (__s1 == (char *)0x0) {
      if (__s2_00 == (char *)0x0) {
        return 0;
      }
    }
    else {
      if (__s2_00 != (char *)0x0) {
        iVar12 = strcmp(__s1,__s2_00);
        return iVar12;
      }
      __s2_00 = (char *)0x0;
    }
    bVar16 = __s2_00 < __s1;
LAB_0010e3e7:
    return bVar16 - 1 | 1;
  }
  if ((bVar16) && (!bVar19)) {
    return 0;
  }
  bVar16 = !bVar18 && !bVar16;
LAB_0010e464:
  return (uint)bVar16 * 2 + -1;
}

Assistant:

int rtosc_arg_vals_cmp_single(const rtosc_arg_val_t* _lhs,
                              const rtosc_arg_val_t* _rhs,
                              const rtosc_cmp_options* opt)
{
#define cmp_3way(val1,val2) (((val1) == (val2)) \
                            ? 0 \
                            : (((val1) > (val2)) ? 1 : -1))
#define mfabs(val) (((val) >= 0) ? (val) : -(val))

    int rval;

    if(!opt)
        opt = &default_cmp_options;

    if(_lhs->type == _rhs->type)
    switch(_lhs->type)
    {
        case 'i':
        case 'c':
        case 'r':
            rval = cmp_3way(_lhs->val.i, _rhs->val.i);
            break;
        case 'I':
        case 'T':
        case 'F':
        case 'N':
            rval = 0;
            break;
        case 'f':
            rval = (opt->float_tolerance == 0.0)
                   ? cmp_3way(_lhs->val.f, _rhs->val.f)
                   : (mfabs(_lhs->val.f - _rhs->val.f)
                      <= (float)opt->float_tolerance)
                      ? 0
                      : ((_lhs->val.f > _rhs->val.f) ? 1 : -1);
            break;
        case 'd':
            rval = (opt->float_tolerance == 0.0)
                   ? cmp_3way(_lhs->val.d, _rhs->val.d)
                   : (mfabs(_lhs->val.d - _rhs->val.d)
                      <= opt->float_tolerance)
                      ? 0
                      : ((_lhs->val.d > _rhs->val.d) ? 1 : -1);
            break;
        case 'h':
            rval = cmp_3way(_lhs->val.h, _rhs->val.h);
            break;
        case 't':
            // immediately is considered lower than everything else
            // this means if you send two events to a client,
            // one being "immediately" and one being different, the
            // immediately-event has the higher priority, event if the
            // other one is in the past
            rval = (_lhs->val.t == 1)
                   ? (_rhs->val.t == 1)
                     ? 0
                     : -1 // _lhs has higher priority => _lhs < _rhs
                   : (_rhs->val.t == 1)
                     ? 1
                     : cmp_3way(_lhs->val.t, _rhs->val.t);
            break;
        case 'm':
            rval = memcmp(_lhs->val.m, _rhs->val.m, 4);
            break;
        case 's':
        case 'S':
            rval = (_lhs->val.s == NULL || _rhs->val.s == NULL)
                 ? cmp_3way(_lhs->val.s, _rhs->val.s)
                 : strcmp(_lhs->val.s, _rhs->val.s);
            break;
        case 'b':
        {
            int32_t lbs = _lhs->val.b.len,
                    rbs = _rhs->val.b.len;
            int32_t minlen = (lbs < rbs) ? lbs : rbs;
            rval = memcmp(_lhs->val.b.data, _rhs->val.b.data, minlen);
            if(lbs != rbs && !rval)
            {
                // both equal until here
                // the string that ends here is lexicographically smaller
                rval = (lbs > rbs)
                       ? _lhs->val.b.data[minlen]
                       : -_rhs->val.b.data[minlen];
            }

            break;
        }
        case 'a':
        {
            int32_t llen = rtosc_av_arr_len(_lhs), rlen = rtosc_av_arr_len(_rhs);
            if(     rtosc_av_arr_type(_lhs) != rtosc_av_arr_type(_rhs)
               && !(rtosc_av_arr_type(_lhs) == 'T' && rtosc_av_arr_type(_rhs))
               && !(rtosc_av_arr_type(_lhs) == 'F' && rtosc_av_arr_type(_rhs)))
                rval = (rtosc_av_arr_type(_lhs) > rtosc_av_arr_type(_rhs)) ? 1 : -1;
            else
            {
                // the arg vals differ in this array => compare and return
                rval = rtosc_arg_vals_cmp(_lhs+1, _rhs+1, llen, rlen, opt);
            }
            break;
        }
        case '-':
            rval = -1;
            // no recovery: the programmer did not pass the right args, and
            // we don't have a function to compare ranges here
            assert(false);
            break;
        default:
            rval = -1;
            assert(false);
    }
    else
    {
        rval = (_lhs->type > _rhs->type) ? 1 : -1;
    }

    return rval;

#undef mfabs
#undef cmp_3way
}